

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O2

void __thiscall
check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d::test_method
          (check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d *this)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  pointer puVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> elems_in_boundary;
  Boundary_range second_bdrange;
  Boundary_range bdrange;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  shared_count sStack_a0;
  vector<double,_std::allocator<double>_> data;
  Bitmap_cubical_complex_base ba;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&sizes,4,(allocator_type *)&ba);
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 3;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 3;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 3;
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 3;
  ba._vptr_Bitmap_cubical_complex_base = (_func_int **)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&data,0x51,(value_type_conflict2 *)&ba,(allocator_type *)&second_bdrange);
  ba._vptr_Bitmap_cubical_complex_base =
       (_func_int **)((ulong)ba._vptr_Bitmap_cubical_complex_base & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::vector
            (&elems_in_boundary,
             (long)(int)((sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[3] * 2 + 1) *
                         (sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[2] * 2 + 1) *
                        (sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[1] * 2 + 1) *
                        (*sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start * 2 + 1)),
             (value_type_conflict4 *)&ba,(allocator_type *)&second_bdrange);
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::Bitmap_cubical_complex_base
            (&ba,&sizes,&data,true);
  for (lVar2 = 0;
      lVar2 != (long)ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)ba.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3; lVar2 = lVar2 + 1) {
    (*ba._vptr_Bitmap_cubical_complex_base[2])(&bdrange,&ba);
    iVar3 = 1;
    for (puVar5 = bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar5 != bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar5 = puVar5 + 1) {
      (*ba._vptr_Bitmap_cubical_complex_base[2])
                (&second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 &ba,*puVar5);
      iVar4 = 1;
      for (puVar1 = second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar1 != (pointer)CONCAT71(second_bdrange.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                      second_bdrange.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_);
          puVar1 = puVar1 + 1) {
        elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[*puVar1] =
             elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[*puVar1] + iVar4 * iVar3;
        iVar4 = -iVar4;
      }
      iVar3 = -iVar3;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    for (lVar6 = 0;
        lVar6 != (long)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2; lVar6 = lVar6 + 1) {
      local_c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_b8 = "";
      local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x445,&local_d0);
      local_b0[0] = elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6] == 0;
      local_a8 = 0;
      sStack_a0.pi_ = (sp_counted_base *)0x0;
      local_e0 = "elems_in_boundary[i] == 0";
      local_d8 = "";
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00122ba8;
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &boost::unit_test::lazy_ostream::inst;
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
      ;
      local_e8 = "";
      boost::test_tools::tt_detail::report_assertion
                (local_b0,&second_bdrange.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>,
                 &local_f0,0x445,1,0,0);
      boost::detail::shared_count::~shared_count(&sStack_a0);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::~Bitmap_cubical_complex_base(&ba);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_if_boundary_of_boundary_is_zero_non_periodic_case_4_d) {
  std::vector<unsigned> sizes(4);
  sizes[0] = 3;
  sizes[1] = 3;
  sizes[2] = 3;
  sizes[3] = 3;

  std::vector<double> data(81, 0);

  int number_of_all_elements = (2 * sizes[0] + 1) * (2 * sizes[1] + 1) * (2 * sizes[2] + 1) * (2 * sizes[3] + 1);
  std::vector<int> elems_in_boundary(number_of_all_elements, 0);
  Bitmap_cubical_complex_base ba(sizes, data);
  for (auto it = ba.all_cells_iterator_begin();
       it != ba.all_cells_iterator_end(); ++it) {    
    int i = 1;
    Bitmap_cubical_complex_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin(); bd != bdrange.end(); ++bd) {
      Bitmap_cubical_complex_base::Boundary_range second_bdrange = ba.boundary_range(*bd);
      int j = 1;
      for (auto bd2 = second_bdrange.begin(); bd2 != second_bdrange.end();
           ++bd2) {
        elems_in_boundary[*bd2] += i * j;
        j *= -1;
      }
      i *= -1;
    }
    // check if there is anything nonzero in elems_in_boundary
    for (size_t i = 0; i != elems_in_boundary.size(); ++i) {
      BOOST_CHECK(elems_in_boundary[i] == 0);
    }
  }
}